

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::SetDataModel(Element *this,DataModel *new_data_model)

{
  code *pcVar1;
  bool bVar2;
  reference this_00;
  pointer this_01;
  ElementPtr *child;
  iterator __end1;
  iterator __begin1;
  OwnedElementList *__range1;
  DataModel *new_data_model_local;
  Element *this_local;
  
  if (((this->data_model != (DataModel *)0x0) && (new_data_model != (DataModel *)0x0)) &&
     (bVar2 = Assert("We must either attach a new data model, or detach the old one.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x83d), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  if ((this->data_model != new_data_model) &&
     (((this->data_model == (DataModel *)0x0 || (new_data_model == (DataModel *)0x0)) ||
      (this->data_model == new_data_model)))) {
    if (this->data_model != (DataModel *)0x0) {
      DataModel::OnElementRemove(this->data_model,this);
    }
    this->data_model = new_data_model;
    if (this->data_model != (DataModel *)0x0) {
      ElementUtilities::ApplyDataViewsControllers(this);
    }
    __end1 = ::std::
             vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ::begin(&this->children);
    child = (ElementPtr *)
            ::std::
            vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
            ::end(&this->children);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                                       *)&child), bVar2) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                ::operator*(&__end1);
      this_01 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_00);
      SetDataModel(this_01,new_data_model);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void Element::SetDataModel(DataModel* new_data_model)
{
	RMLUI_ASSERTMSG(!data_model || !new_data_model, "We must either attach a new data model, or detach the old one.");

	if (data_model == new_data_model)
		return;

	// stop descent if a nested data model is encountered
	if (data_model && new_data_model && data_model != new_data_model)
		return;

	if (data_model)
		data_model->OnElementRemove(this);

	data_model = new_data_model;

	if (data_model)
		ElementUtilities::ApplyDataViewsControllers(this);

	for (ElementPtr& child : children)
		child->SetDataModel(new_data_model);
}